

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O2

int __thiscall de::Socket::close(Socket *this,int __fd)

{
  SocketError *this_00;
  deBool dVar1;
  allocator<char> local_39;
  string local_38;
  
  dVar1 = deSocket_close(this->m_socket);
  if (dVar1 != 0) {
    return dVar1;
  }
  this_00 = (SocketError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Closing socket failed",&local_39);
  SocketError::SocketError(this_00,&local_38);
  __cxa_throw(this_00,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::close (void)
{
	if (!deSocket_close(m_socket))
		throw SocketError("Closing socket failed");
}